

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O3

void __thiscall ot::commissioner::JobManager::CleanupJobs(JobManager *this)

{
  pointer ppJVar1;
  Job *this_00;
  bool bVar2;
  pointer ppJVar3;
  
  ppJVar3 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppJVar1 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppJVar3 != ppJVar1) {
    do {
      this_00 = *ppJVar3;
      if (this_00 != (Job *)0x0) {
        bVar2 = Job::IsStopped(this_00);
        if (!bVar2) {
          __assert_fail("condition",
                        "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                        ,0x6c,"void ot::commissioner::JobManager::CleanupJobs()");
        }
        Job::~Job(this_00);
      }
      operator_delete(this_00);
      ppJVar3 = ppJVar3 + 1;
    } while (ppJVar3 != ppJVar1);
    ppJVar3 = (this->mJobPool).
              super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->mJobPool).
        super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppJVar3) {
      (this->mJobPool).
      super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppJVar3;
    }
  }
  (this->mImportFile)._M_string_length = 0;
  *(this->mImportFile)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void JobManager::CleanupJobs()
{
    for (auto job : mJobPool)
    {
        ASSERT(job == nullptr || job->IsStopped());
        delete job;
    }
    mJobPool.clear();
    mImportFile.clear();
}